

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void shift_reg(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  int32_t arg2;
  TCGContext_conflict2 *s_00;
  uint uVar1;
  TCGv_i32 arg;
  TCGTemp *a1;
  TCGTemp *a3;
  TCGTemp *pTVar2;
  TCGv_i32 c2;
  TCGv_i64 c2_00;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_4;
  TCGv_i32 ret_00;
  TCGv_i64 ret_01;
  
  s_00 = s->uc->tcg_ctx;
  arg2 = *(int32_t *)(&DAT_00d8852c + (long)opsize * 4);
  uVar1 = insn & 7;
  arg = gen_extend(s,s_00->cpu_dregs[uVar1],opsize,(insn & 8) >> 3 ^ 1);
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I64,false);
  ret_01 = (TCGv_i64)((long)a1 - (long)s_00);
  a3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a3 - (long)s_00);
  pTVar2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar2 - (long)s_00);
  tcg_gen_andi_i32_m68k
            (s_00,ret_00,*(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38)),0x3f);
  tcg_gen_extu_i32_i64_m68k(s_00,ret,ret_00);
  tcg_gen_extu_i32_i64_m68k(s_00,ret_01,arg);
  tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)s_00),0);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_shli_i64_m68k(s_00,ret_01,ret_01,0x20);
    tcg_gen_op3_m68k(s_00,((insn & 8) == 0) + INDEX_op_shr_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    tcg_gen_extr_i64_i32_m68k(s_00,QREG_CC_C,QREG_CC_N,ret_01);
    tcg_gen_shri_i32_m68k(s_00,QREG_CC_C,QREG_CC_C,0x1f);
    tcg_gen_movcond_i32_m68k(s_00,TCG_COND_NE,QREG_CC_X,ret_00,QREG_CC_V,QREG_CC_C,QREG_CC_X);
  }
  else {
    tcg_gen_op3_m68k(s_00,INDEX_op_shl_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    if (opsize == 2) {
      tcg_gen_extr_i64_i32_m68k(s_00,QREG_CC_N,QREG_CC_C,ret_01);
    }
    else {
      c2 = tcg_const_i32_m68k(s_00,0);
      tcg_gen_extrl_i64_i32_m68k(s_00,QREG_CC_N,ret_01);
      tcg_gen_shri_i32_m68k(s_00,QREG_CC_C,QREG_CC_N,arg2);
      tcg_gen_movcond_i32_m68k(s_00,TCG_COND_EQ,QREG_CC_C,ret_00,c2,c2,QREG_CC_C);
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(c2 + (long)s_00));
    }
    tcg_gen_andi_i32_m68k(s_00,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_movcond_i32_m68k(s_00,TCG_COND_NE,QREG_CC_X,ret_00,QREG_CC_V,QREG_CC_C,QREG_CC_X);
    if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
      c2_00 = tcg_const_i64_m68k(s_00,0x20);
      tcg_gen_movcond_i64_m68k(s_00,TCG_COND_GT,ret,ret,c2_00,c2_00,ret);
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(c2_00 + (long)s_00));
      tcg_gen_ext_i32_i64_m68k(s_00,ret_01,arg);
      tcg_gen_op3_m68k(s_00,INDEX_op_shl_i64,(TCGArg)a3,(TCGArg)a1,(TCGArg)a3);
      tcg_gen_op3_m68k(s_00,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
      tcg_gen_andi_i64_m68k(s_00,ret_01,ret_01,-1L << ((char)arg2 - 1U & 0x3f));
      tcg_gen_setcondi_i64_m68k(s_00,TCG_COND_NE,ret_01,ret_01,0);
      tcg_gen_extrl_i64_i32_m68k(s_00,QREG_CC_V,ret_01);
      tcg_gen_op2_m68k(s_00,INDEX_op_neg_i32,(TCGArg)(QREG_CC_V + (long)s_00),
                       (TCGArg)(QREG_CC_V + (long)s_00));
    }
  }
  if (opsize != 2) {
    if (opsize == 1) {
      tcg_gen_ext16s_i32_m68k(s_00,QREG_CC_N,QREG_CC_N);
    }
    else {
      if (opsize != 0) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x24c,(char *)0x0);
      }
      tcg_gen_ext8s_i32_m68k(s_00,QREG_CC_N,QREG_CC_N);
    }
  }
  if (QREG_CC_Z != QREG_CC_N) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)s_00),
                     (TCGArg)(QREG_CC_N + (long)s_00));
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_01 + (long)s_00));
  gen_partset_reg(s_00,opsize,s_00->cpu_dregs[uVar1],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void shift_reg(TCGContext *tcg_ctx, TCGv_i64 dst, TCGv_i64 src, int sf,
                      enum a64_shift_type shift_type, TCGv_i64 shift_amount)
{
    switch (shift_type) {
    case A64_SHIFT_TYPE_LSL:
        tcg_gen_shl_i64(tcg_ctx, dst, src, shift_amount);
        break;
    case A64_SHIFT_TYPE_LSR:
        tcg_gen_shr_i64(tcg_ctx, dst, src, shift_amount);
        break;
    case A64_SHIFT_TYPE_ASR:
        if (!sf) {
            tcg_gen_ext32s_i64(tcg_ctx, dst, src);
        }
        tcg_gen_sar_i64(tcg_ctx, dst, sf ? src : dst, shift_amount);
        break;
    case A64_SHIFT_TYPE_ROR:
        if (sf) {
            tcg_gen_rotr_i64(tcg_ctx, dst, src, shift_amount);
        } else {
            TCGv_i32 t0, t1;
            t0 = tcg_temp_new_i32(tcg_ctx);
            t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_extrl_i64_i32(tcg_ctx, t0, src);
            tcg_gen_extrl_i64_i32(tcg_ctx, t1, shift_amount);
            tcg_gen_rotr_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_extu_i32_i64(tcg_ctx, dst, t0);
            tcg_temp_free_i32(tcg_ctx, t0);
            tcg_temp_free_i32(tcg_ctx, t1);
        }
        break;
    default:
        assert(FALSE); /* all shift types should be handled */
        break;
    }

    if (!sf) { /* zero extend final result */
        tcg_gen_ext32u_i64(tcg_ctx, dst, dst);
    }
}